

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IColourImpl * Catch::anon_unknown_23::platformColourInstance(void)

{
  int iVar1;
  IMutableContext *pIVar2;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  IColourImpl *pIVar3;
  char *pcVar4;
  Ptr<const_Catch::IConfig> config;
  long *local_10;
  
  pIVar2 = getCurrentMutableContext();
  (*(pIVar2->super_IContext)._vptr_IContext[6])(&local_10,pIVar2);
  if (local_10 == (long *)0x0) {
LAB_0012deec:
    iVar1 = isatty(1);
    if (iVar1 != 0) goto LAB_0012defa;
LAB_0012df1d:
    pIVar3 = (IColourImpl *)&(anonymous_namespace)::NoColourImpl::instance()::s_instance;
    if ((anonymous_namespace)::NoColourImpl::instance()::s_instance != '\0') goto LAB_0012df2e;
    _GLOBAL__N_1::platformColourInstance();
    if ((extraout_RAX_00 & 1) != 0) goto LAB_0012df2e;
    pcVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  else {
    iVar1 = (**(code **)(*local_10 + 0x80))();
    if (iVar1 != 1) {
      if (iVar1 == 0) goto LAB_0012deec;
      goto LAB_0012df1d;
    }
LAB_0012defa:
    pIVar3 = (IColourImpl *)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
    if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance != '\0') goto LAB_0012df2e;
    _GLOBAL__N_1::platformColourInstance();
    if ((extraout_RAX & 1) != 0) goto LAB_0012df2e;
    pcVar4 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
  }
  __cxa_guard_release(pcVar4);
LAB_0012df2e:
  if (local_10 != (long *)0x0) {
    (**(code **)(*local_10 + 0x18))();
  }
  return pIVar3;
}

Assistant:

IContext& getCurrentContext() {
        return getCurrentMutableContext();
    }